

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_gfx_rotatef(float angleDeg,float x,float y,float z)

{
  rf_mat left;
  rf_mat right;
  rf_vec3 rVar1;
  rf_mat *__dest;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined1 local_120 [64];
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  rf_mat local_a4;
  float local_64;
  float fStack_60;
  rf_vec3 axis;
  rf_mat mat_rotation;
  float z_local;
  float y_local;
  float x_local;
  float angleDeg_local;
  
  rf_mat_identity();
  local_c0 = CONCAT44(y,x);
  rVar1.z = z;
  rVar1.x = x;
  rVar1.y = y;
  local_b8 = z;
  local_64 = x;
  fStack_60 = y;
  axis.x = z;
  rVar1 = rf_vec3_normalize(rVar1);
  local_d8 = rVar1.z;
  local_e0 = rVar1._0_8_;
  local_d0 = local_e0;
  local_c8 = local_d8;
  local_b0 = local_e0;
  local_a8 = local_d8;
  rf_mat_rotate(&local_a4,rVar1,angleDeg * 0.017453292);
  memcpy(&axis.y,&local_a4,0x40);
  __dest = (rf__ctx->field_0).current_matrix;
  memcpy(&local_160,(rf__ctx->field_0).current_matrix,0x40);
  left._8_8_ = mat_rotation._8_8_;
  left._0_8_ = mat_rotation._0_8_;
  left._16_8_ = mat_rotation._16_8_;
  left._24_8_ = mat_rotation._24_8_;
  left._32_8_ = mat_rotation._32_8_;
  left._40_8_ = mat_rotation._40_8_;
  left._48_8_ = mat_rotation._48_8_;
  left.m11 = (float)(undefined4)local_160;
  left.m15 = (float)local_160._4_4_;
  right.m8 = (float)(undefined4)local_150;
  right.m12 = (float)local_150._4_4_;
  right.m0 = (float)(undefined4)uStack_158;
  right.m4 = (float)uStack_158._4_4_;
  right.m1 = (float)(undefined4)uStack_148;
  right.m5 = (float)uStack_148._4_4_;
  right.m9 = (float)(undefined4)local_140;
  right.m13 = (float)local_140._4_4_;
  right.m2 = (float)(undefined4)uStack_138;
  right.m6 = (float)uStack_138._4_4_;
  right.m10 = (float)(undefined4)local_130;
  right.m14 = (float)local_130._4_4_;
  right.m3 = (float)(undefined4)uStack_128;
  right.m7 = (float)uStack_128._4_4_;
  right._56_8_ = __dest;
  rf_mat_mul(left,right);
  memcpy(__dest,local_120,0x40);
  return;
}

Assistant:

RF_API void rf_gfx_rotatef(float angleDeg, float x, float y, float z)
{
    rf_mat mat_rotation = rf_mat_identity();

    rf_vec3 axis = (rf_vec3){x, y, z };
    mat_rotation = rf_mat_rotate(rf_vec3_normalize(axis), angleDeg * RF_DEG2RAD);

    // NOTE: We transpose matrix with multiplication order
    *rf_ctx.current_matrix = rf_mat_mul(mat_rotation, *rf_ctx.current_matrix);
}